

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O0

void __thiscall
Infector::AnyShared<CFooBar,IFoo,IBar>::resolve_multiple_cast<IFoo,IBar>
          (AnyShared<CFooBar,IFoo,IBar> *this,CFooBar *tp)

{
  mapped_type *ppvVar1;
  mapped_type local_30;
  type_index local_28;
  mapped_type local_20;
  IFoo *base;
  CFooBar *tp_local;
  AnyShared<CFooBar,_IFoo,_IBar> *this_local;
  
  local_30 = (mapped_type)0x0;
  if (tp != (CFooBar *)0x0) {
    local_30 = &tp->field_0x0 + *(long *)(*(long *)tp + -0x28);
  }
  local_20 = local_30;
  base = (IFoo *)tp;
  tp_local = (CFooBar *)this;
  std::type_index::type_index(&local_28,(type_info *)&IFoo::typeinfo);
  ppvVar1 = std::
            unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
            ::operator[]((unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
                          *)(this + 0x20),&local_28);
  *ppvVar1 = local_30;
  AnyShared<CFooBar,_IFoo,_IBar>::resolve_multiple_cast<IBar>
            ((AnyShared<CFooBar,_IFoo,_IBar> *)this,(CFooBar *)base);
  return;
}

Assistant:

void resolve_multiple_cast(T*tp){
            Base1* base  = tp;
            multi_solver[std::type_index(typeid(Base1))]
                          = reinterpret_cast<void*>(base);
            resolve_multiple_cast<NextBase,Others...>(tp);
        }